

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarextension.cpp
# Opt level: O0

bool __thiscall QToolBarExtension::event(QToolBarExtension *this,QEvent *event)

{
  bool bVar1;
  Type TVar2;
  QEvent *in_RSI;
  QToolBarExtension *in_RDI;
  
  TVar2 = QEvent::type(in_RSI);
  if (TVar2 == LayoutDirectionChange) {
    setOrientation(in_RDI,(Orientation)((ulong)in_RSI >> 0x20));
  }
  bVar1 = QToolButton::event(&this->super_QToolButton,event);
  return bVar1;
}

Assistant:

bool QToolBarExtension::event(QEvent *event)
{
    switch (event->type()) {
    case QEvent::LayoutDirectionChange:
        setOrientation(m_orientation);
        break;
    default:
        break;
    }
    return QToolButton::event(event);
}